

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuVfsSync(sqlite3_file *pFile,int flags)

{
  int iVar1;
  rbu_file *p;
  
  if ((pFile[3].pMethods != (sqlite3_io_methods *)0x0) && ((pFile[3].pMethods)->iVersion == 3)) {
    return *(uint *)&pFile[5].pMethods >> 7 & 2;
  }
  iVar1 = (**(code **)(*(long *)pFile[1].pMethods + 0x28))();
  return iVar1;
}

Assistant:

static int rbuVfsSync(sqlite3_file *pFile, int flags){
  rbu_file *p = (rbu_file *)pFile;
  if( p->pRbu && p->pRbu->eStage==RBU_STAGE_CAPTURE ){
    if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
      return SQLITE_INTERNAL;
    }
    return SQLITE_OK;
  }
  return p->pReal->pMethods->xSync(p->pReal, flags);
}